

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O1

void Cof_ManPrintFanio(Cof_Man_t *p)

{
  Cof_Obj_t *pCVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  void *__s;
  int *piVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  char Buffer [100];
  void *local_f0;
  void *local_e0;
  double local_a8;
  double local_a0;
  char local_98 [104];
  
  if (p->nObjData < 1) {
    dVar17 = 0.0;
    local_a0 = 0.0;
    uVar11 = 0;
    uVar16 = 0;
    uVar10 = 0;
    local_a8 = 0.0;
  }
  else {
    uVar9 = 0;
    iVar7 = 0;
    iVar13 = 0;
    iVar12 = 0;
    uVar10 = 0;
    uVar16 = 0;
    uVar11 = 0;
    do {
      if (p->pObjData == (int *)0x0) break;
      pCVar1 = (Cof_Obj_t *)(p->pObjData + uVar9);
      if (((int)uVar9 != 0) && (uVar14 = *(uint *)pCVar1, (uVar14 & 1) == 0)) {
        uVar3 = 0;
        if (0x1ff < uVar14) {
          *(uint *)pCVar1 = uVar14 & 0xfe | 0x100;
          uVar3 = Cof_NodeDeref_rec(pCVar1);
          uVar4 = Cof_NodeRef_rec(pCVar1);
          *(uint *)pCVar1 = CONCAT31((int3)(uVar14 >> 8),*(undefined1 *)pCVar1);
          if (uVar3 != uVar4) goto LAB_00713270;
        }
        uVar4 = uVar14 >> 4 & 0xf;
        uVar14 = uVar14 >> 8;
        iVar12 = iVar12 + uVar4;
        iVar13 = iVar13 + uVar14;
        iVar7 = iVar7 + uVar3;
        if (uVar11 <= uVar4) {
          uVar11 = uVar4;
        }
        if (uVar16 <= uVar14) {
          uVar16 = uVar14;
        }
        if ((int)uVar10 <= (int)uVar3) {
          uVar10 = uVar3;
        }
      }
      uVar14 = (int)uVar9 + (*(uint *)pCVar1 >> 8) + (*(uint *)pCVar1 >> 4 & 0xf) + 6;
      uVar9 = (ulong)uVar14;
    } while ((int)uVar14 < p->nObjData);
    local_a0 = (double)iVar12;
    local_a8 = (double)iVar13;
    dVar17 = (double)iVar7;
  }
  uVar14 = uVar11;
  if (1 < uVar11) {
    uVar4 = 0;
    uVar14 = 0;
    uVar3 = uVar11 - 1;
    if (uVar3 != 0) {
      do {
        uVar14 = uVar4 + 1;
        bVar2 = 9 < uVar3;
        uVar3 = uVar3 / 10;
        uVar4 = uVar14;
      } while (bVar2);
    }
  }
  uVar14 = uVar14 * 10 + 10;
  uVar3 = uVar16;
  if (1 < uVar16) {
    uVar5 = 0;
    uVar3 = 0;
    uVar4 = uVar16 - 1;
    if (uVar4 != 0) {
      do {
        uVar3 = uVar5 + 1;
        bVar2 = 9 < uVar4;
        uVar4 = uVar4 / 10;
        uVar5 = uVar3;
      } while (bVar2);
    }
  }
  uVar3 = uVar3 * 10 + 10;
  if ((int)uVar3 < (int)uVar14) {
    uVar3 = uVar14;
  }
  uVar14 = uVar10;
  if (1 < uVar10) {
    uVar5 = 0;
    uVar14 = 0;
    uVar4 = uVar10 - 1;
    if (uVar4 != 0) {
      do {
        uVar14 = uVar5 + 1;
        bVar2 = 9 < uVar4;
        uVar4 = uVar4 / 10;
        uVar5 = uVar14;
      } while (bVar2);
    }
  }
  uVar14 = uVar14 * 10 + 10;
  if ((int)uVar3 < (int)uVar14) {
    uVar3 = uVar14;
  }
  uVar14 = 0x10;
  if (0xe < uVar3 - 1) {
    uVar14 = uVar3;
  }
  lVar15 = (long)(int)uVar14;
  if (uVar14 == 0) {
    local_f0 = (void *)0x0;
  }
  else {
    local_f0 = malloc(lVar15 * 4);
  }
  lVar8 = (long)(int)uVar3;
  if (local_f0 != (void *)0x0) {
    memset(local_f0,0,lVar8 * 4);
  }
  if (uVar14 == 0) {
    local_e0 = (void *)0x0;
  }
  else {
    local_e0 = malloc(lVar15 * 4);
  }
  if (local_e0 != (void *)0x0) {
    memset(local_e0,0,lVar8 * 4);
  }
  if (uVar14 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc(lVar15 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,lVar8 << 2);
  }
  if (p->nObjData < 1) {
    dVar18 = 0.0;
  }
  else {
    iVar7 = 0;
    uVar9 = 0;
    do {
      if (p->pObjData == (int *)0x0) break;
      pCVar1 = (Cof_Obj_t *)(p->pObjData + uVar9);
      if (((int)uVar9 != 0) && (uVar14 = *(uint *)pCVar1, (uVar14 & 1) == 0)) {
        uVar4 = 0;
        if (0x1ff < uVar14) {
          *(uint *)pCVar1 = uVar14 & 0xfe | 0x100;
          uVar4 = Cof_NodeDeref_rec(pCVar1);
          uVar5 = Cof_NodeRef_rec(pCVar1);
          *(uint *)pCVar1 = CONCAT31((int3)(uVar14 >> 8),*(undefined1 *)pCVar1);
          if (uVar4 != uVar5) {
LAB_00713270:
            __assert_fail("Count1 == Count2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCof.c"
                          ,0x24e,"int Cof_ObjMffcSize(Cof_Obj_t *)");
          }
        }
        uVar5 = uVar14 >> 4 & 0xf;
        if (uVar5 < 10) {
          if ((int)uVar3 <= (int)uVar5) goto LAB_00713251;
          piVar6 = (int *)((long)local_f0 + (ulong)uVar5 * 4);
        }
        else {
          piVar6 = (int *)((long)local_f0 + 0x2c);
          if ((int)uVar3 < 0xc) goto LAB_00713251;
        }
        *piVar6 = *piVar6 + 1;
        if (uVar14 < 0xa00) {
          uVar14 = uVar14 >> 8;
LAB_00712ef0:
          if ((int)uVar3 <= (int)uVar14) goto LAB_00713251;
          piVar6 = (int *)((long)local_e0 + (ulong)uVar14 * 4);
          *piVar6 = *piVar6 + 1;
        }
        else {
          if (uVar14 < 0x6400) {
            uVar14 = uVar14 / 0xa00 + 10;
            goto LAB_00712ef0;
          }
          if (uVar14 < 0x3e800) {
            uVar14 = uVar14 / 0x6400 + 0x14;
            goto LAB_00712ef0;
          }
          if (uVar14 < 0x271000) {
            uVar14 = uVar14 / 0x3e800 + 0x1e;
            goto LAB_00712ef0;
          }
          if (uVar14 < 25600000) {
            uVar14 = uVar14 / 0x271000 + 0x28;
            goto LAB_00712ef0;
          }
          if (uVar14 < 256000000) {
            uVar14 = uVar14 / 25600000 + 0x32;
            goto LAB_00712ef0;
          }
          if (uVar14 < 2560000000) {
            uVar14 = uVar14 / 256000000 + 0x3c;
            goto LAB_00712ef0;
          }
        }
        if (uVar4 != 0) {
          iVar7 = iVar7 + 1;
          if ((int)uVar4 < 10) {
            if ((int)uVar4 < 0) goto LAB_00713251;
          }
          else if ((int)uVar4 < 100) {
            uVar4 = uVar4 / 10 + 10;
          }
          else if ((int)uVar4 < 1000) {
            uVar4 = uVar4 / 100 + 0x14;
          }
          else if ((int)uVar4 < 10000) {
            uVar4 = uVar4 / 1000 + 0x1e;
          }
          else if ((int)uVar4 < 100000) {
            uVar4 = uVar4 / 10000 + 0x28;
          }
          else if ((int)uVar4 < 1000000) {
            uVar4 = uVar4 / 100000 + 0x32;
          }
          else {
            if (9999999 < (int)uVar4) goto LAB_00712fee;
            uVar4 = uVar4 / 1000000 + 0x3c;
          }
          if ((int)uVar3 <= (int)uVar4) {
LAB_00713251:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          piVar6 = (int *)((long)__s + (ulong)uVar4 * 4);
          *piVar6 = *piVar6 + 1;
        }
      }
LAB_00712fee:
      uVar14 = (int)uVar9 + (*(uint *)pCVar1 >> 8) + (*(uint *)pCVar1 >> 4 & 0xf) + 6;
      uVar9 = (ulong)uVar14;
    } while ((int)uVar14 < p->nObjData);
    dVar18 = (double)iVar7;
  }
  puts("The distribution of fanins, fanouts. and MFFCs in the network:");
  puts("         Number    Nodes with fanin   Nodes with fanout   Nodes with MFFC");
  if (0 < (int)uVar3) {
    uVar9 = 0;
    do {
      if (((*(int *)((long)local_f0 + uVar9 * 4) != 0) ||
          (*(int *)((long)local_e0 + uVar9 * 4) != 0)) || (*(int *)((long)__s + uVar9 * 4) != 0)) {
        if (uVar9 < 10) {
          printf("%15d : ",uVar9 & 0xffffffff);
        }
        else {
          iVar7 = (int)((uVar9 & 0xffffffff) / 10) * -10;
          dVar20 = (double)(int)((uVar9 & 0xffffffff) / 10);
          dVar19 = pow(10.0,dVar20);
          dVar20 = pow(10.0,dVar20);
          sprintf(local_98,"%d - %d",(ulong)(uint)(((int)uVar9 + iVar7) * (int)dVar19),
                  (ulong)(((int)uVar9 + iVar7 + 1) * (int)dVar20 - 1));
          printf("%15s : ",local_98);
        }
        if (*(int *)((long)local_f0 + uVar9 * 4) == 0) {
          printf("              ");
        }
        else {
          printf("%11d   ");
        }
        printf("    ");
        if (*(int *)((long)local_e0 + uVar9 * 4) == 0) {
          printf("              ");
        }
        else {
          printf("%12d  ");
        }
        printf("    ");
        if (*(int *)((long)__s + uVar9 * 4) == 0) {
          printf("               ");
        }
        else {
          printf("  %12d  ");
        }
        putchar(10);
      }
      uVar9 = uVar9 + 1;
    } while (uVar3 != uVar9);
  }
  if (local_f0 != (void *)0x0) {
    free(local_f0);
  }
  if (local_e0 != (void *)0x0) {
    free(local_e0);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  printf("Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.  MFFCs: Max = %d. Ave =  %.2f.\n"
         ,local_a0 / (double)p->nNodes,local_a8 / (double)p->nNodes,dVar17 / dVar18,(ulong)uVar11,
         (ulong)uVar16,(ulong)uVar10);
  return;
}

Assistant:

void Cof_ManPrintFanio( Cof_Man_t * p )
{
    char Buffer[100];
    Cof_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts, * vMffcs;
    int nFanins, nFanouts, nMffcs, nFaninsMax, nFanoutsMax, nMffcsMax, nFaninsAll, nFanoutsAll, nMffcsAll;
    int i, k, nSizeMax, nMffcNodes = 0;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = nMffcsMax = 0;
    nFaninsAll = nFanoutsAll = nMffcsAll = 0;
    Cof_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue;
        nFanins  = Cof_ObjFaninNum(pNode);
        nFanouts = Cof_ObjFanoutNum(pNode);
        nMffcs   = pNode->nFanouts > 1 ? Cof_ObjMffcSize(pNode) : 0;
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nMffcsAll   += nMffcs;
        nFaninsMax   = Abc_MaxInt( nFaninsMax,  nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
        nMffcsMax    = Abc_MaxInt( nMffcsMax,   nMffcs );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nMffcsMax) + 1),  nSizeMax );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );
    vMffcs   = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Cof_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue;
        nFanins  = Cof_ObjFaninNum(pNode);
        nFanouts = Cof_ObjFanoutNum(pNode);
        nMffcs   = pNode->nFanouts > 1 ? Cof_ObjMffcSize(pNode) : 0;

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
       
        if ( nMffcs == 0 )
            continue;
        nMffcNodes++;

        if ( nMffcs < 10 )
            Vec_IntAddToEntry( vMffcs, nMffcs, 1 );
        else if ( nMffcs < 100 )
            Vec_IntAddToEntry( vMffcs, 10 + nMffcs/10, 1 );
        else if ( nMffcs < 1000 )
            Vec_IntAddToEntry( vMffcs, 20 + nMffcs/100, 1 );
        else if ( nMffcs < 10000 )
            Vec_IntAddToEntry( vMffcs, 30 + nMffcs/1000, 1 );
        else if ( nMffcs < 100000 )
            Vec_IntAddToEntry( vMffcs, 40 + nMffcs/10000, 1 );
        else if ( nMffcs < 1000000 )
            Vec_IntAddToEntry( vMffcs, 50 + nMffcs/100000, 1 );
        else if ( nMffcs < 10000000 )
            Vec_IntAddToEntry( vMffcs, 60 + nMffcs/1000000, 1 );
    }

    printf( "The distribution of fanins, fanouts. and MFFCs in the network:\n" );
    printf( "         Number    Nodes with fanin   Nodes with fanout   Nodes with MFFC\n" );

    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 && vMffcs->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            printf( "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 ); 
            printf( "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%11d   ", vFanins->pArray[k] );
        printf( "    " );
        if ( vFanouts->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanouts->pArray[k] );
        printf( "    " );
        if ( vMffcs->pArray[k] == 0 )
            printf( "               " );
        else
            printf( "  %12d  ", vMffcs->pArray[k] );
        printf( "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );
    Vec_IntFree( vMffcs );

    printf( "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.  MFFCs: Max = %d. Ave =  %.2f.\n", 
        nFaninsMax,  1.0*nFaninsAll /Cof_ManNodeNum(p), 
        nFanoutsMax, 1.0*nFanoutsAll/Cof_ManNodeNum(p), 
        nMffcsMax,   1.0*nMffcsAll  /nMffcNodes  );
}